

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

void discordpp::from_json
               (json *j,field<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_> *f)

{
  state sVar1;
  pointer __p;
  pointer __p_00;
  vector<discordpp::Embed,_std::allocator<discordpp::Embed>_> local_38;
  __uniq_ptr_impl<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
  local_20;
  
  if (j->m_type == null) {
    std::
    __uniq_ptr_impl<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
             *)f,(pointer)0x0);
    sVar1 = nulled_e;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_0>(&local_38,j);
    __p_00 = (pointer)operator_new(0x18);
    (__p_00->super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_38.super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__p_00->super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__p_00->super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<discordpp::Embed,_std::allocator<discordpp::Embed>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_20._M_t.
    super__Tuple_impl<0UL,_std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_*,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
    .
    super__Head_base<0UL,_std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_*,_false>
    ._M_head_impl =
         (tuple<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_*,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
          )(_Tuple_impl<0UL,_std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_*,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
            )0x0;
    std::
    __uniq_ptr_impl<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
             *)f,__p_00);
    std::
    unique_ptr<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
                   *)&local_20);
    std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>::~vector(&local_38);
    sVar1 = present_e;
  }
  f->s_ = sVar1;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }